

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

void __thiscall Lexer::skip(Lexer *this,char ch,char left,char right)

{
  char cVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  anon_class_8_1_8991fb9c yynext;
  
  if (ch == left) {
    iVar3 = 1;
    yynext.this = this;
LAB_0010cb5c:
    cVar1 = this->yychar;
    if (cVar1 != '\0') {
      skip::anon_class_8_1_8991fb9c::operator()(&yynext);
      cVar2 = this->yychar;
      if (cVar2 == '/' && cVar1 == '/') {
        cVar1 = '/';
        while ((cVar1 != '\0' && (cVar1 != '\n'))) {
          skip::anon_class_8_1_8991fb9c::operator()(&yynext);
          cVar1 = this->yychar;
        }
      }
      else if ((cVar1 == '/') && (cVar2 == '*')) {
        skip::anon_class_8_1_8991fb9c::operator()(&yynext);
        cVar1 = this->yychar;
        do {
          if (cVar1 == '\0') goto LAB_0010cb5c;
          skip::anon_class_8_1_8991fb9c::operator()(&yynext);
          bVar4 = cVar1 != '*';
          cVar1 = this->yychar;
        } while (this->yychar != '/' || bVar4);
        skip::anon_class_8_1_8991fb9c::operator()(&yynext);
      }
      else {
        if (cVar1 == ch) {
          iVar3 = iVar3 + 1;
        }
        else if ((cVar1 == right) && (iVar3 = iVar3 + -1, iVar3 == 0)) {
          return;
        }
        if ((cVar1 == '\'') || (cVar1 == '\"')) {
          while ((cVar2 != '\0' &&
                 (skip::anon_class_8_1_8991fb9c::operator()(&yynext), cVar2 != cVar1))) {
            bVar4 = cVar2 == '\\';
            cVar2 = this->yychar;
            if (cVar2 != '\0' && bVar4) {
              skip::anon_class_8_1_8991fb9c::operator()(&yynext);
              cVar2 = this->yychar;
            }
          }
        }
      }
      goto LAB_0010cb5c;
    }
  }
  return;
}

Assistant:

void Lexer::skip(char ch, char left, char right) {
  if (ch == left) {
    int count = 1;
    auto yynext = [this] {
      yytext += yychar;
      yyinp();
    };
    while (auto ch = yychar) {
      yynext();
      if (ch == '/' && yychar == '/') {
        while (yychar && yychar != '\n') yynext();
        continue;
      }
      if (ch == '/' && yychar == '*') {
        yynext();
        while (auto ch = yychar) {
          yynext();
          if (ch == '*' && yychar == '/') {
            yynext();
            break;
          }
        }
        continue;
      }
      if (ch == left) {
        ++count;
      } else if (ch == right) {
        if (!--count) break;
      }
      if (ch == '"' || ch == '\'') {
        auto quote = ch;
        while (auto ch = yychar) {
          yynext();
          if (ch == quote) break;
          if (ch == '\\' && yychar) yynext();
        }
      }
    }
  }
}